

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::BuiltInFunctionStmtBlock> __thiscall
kratos::Generator::builtin_function(Generator *this,string *func_name)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_bool>
  pVar2;
  shared_ptr<kratos::BuiltInFunctionStmtBlock> sVar3;
  uint local_34;
  string *local_30;
  undefined1 local_21;
  undefined1 local_20 [8];
  string *func_name_local;
  Generator *this_local;
  shared_ptr<kratos::BuiltInFunctionStmtBlock> *p;
  
  local_21 = 0;
  local_30 = func_name;
  local_20 = (undefined1  [8])in_RDX;
  func_name_local = func_name;
  this_local = this;
  std::make_shared<kratos::BuiltInFunctionStmtBlock,kratos::Generator*,std::__cxx11::string_const&>
            ((Generator **)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
                  *)((long)&func_name[0x1d].field_2 + 8));
  local_34 = (uint)sVar1;
  std::
  map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
  ::emplace<unsigned_int,std::__cxx11::string_const&>
            ((map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
              *)&func_name[0x1f]._M_string_length,&local_34,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20);
  pVar2 = std::
          map<std::__cxx11::string,std::shared_ptr<kratos::FunctionStmtBlock>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>>
          ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::BuiltInFunctionStmtBlock>&>
                    ((map<std::__cxx11::string,std::shared_ptr<kratos::FunctionStmtBlock>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>>
                      *)(func_name[0x1d].field_2._M_local_buf + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20,
                     (shared_ptr<kratos::BuiltInFunctionStmtBlock> *)this);
  sVar3.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = pVar2._8_8_;
  sVar3.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::BuiltInFunctionStmtBlock>)
         sVar3.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BuiltInFunctionStmtBlock> Generator::builtin_function(
    const std::string &func_name) {
    auto p = std::make_shared<BuiltInFunctionStmtBlock>(this, func_name);
    func_index_.emplace(static_cast<uint32_t>(funcs_.size()), func_name);
    funcs_.emplace(func_name, p);
    return p;
}